

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_entity_t * ecs_bulk_new_w_entity(ecs_world_t *world,ecs_entity_t entity,int32_t count)

{
  _Bool _Var1;
  ecs_table_t *table_00;
  ecs_table_t *table;
  ecs_entity_t *ids;
  ecs_entities_t components;
  ecs_stage_t *stage;
  ecs_entity_t eStack_20;
  int32_t count_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  eStack_20 = entity;
  entity_local = (ecs_entity_t)world;
  components._8_8_ = ecs_get_stage((ecs_world_t **)&entity_local);
  ids = &stack0xffffffffffffffe0;
  components.array._0_4_ = 1;
  _Var1 = ecs_defer_bulk_new((ecs_world_t *)entity_local,(ecs_stage_t *)components._8_8_,count,
                             (ecs_entities_t *)&ids,(void **)0x0,(ecs_entity_t **)&table);
  if (_Var1) {
    world_local = (ecs_world_t *)table;
  }
  else {
    table_00 = ecs_table_find_or_create((ecs_world_t *)entity_local,(ecs_entities_t *)&ids);
    table = (ecs_table_t *)
            new_w_data((ecs_world_t *)entity_local,table_00,(ecs_entities_t *)0x0,count,(void **)0x0
                       ,(int32_t *)0x0);
    ecs_defer_flush((ecs_world_t *)entity_local,(ecs_stage_t *)components._8_8_);
    world_local = (ecs_world_t *)table;
  }
  return (ecs_entity_t *)world_local;
}

Assistant:

const ecs_entity_t* ecs_bulk_new_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    int32_t count)
{
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_entities_t components = {
        .array = &entity,
        .count = 1
    };
    const ecs_entity_t *ids;
    if (ecs_defer_bulk_new(world, stage, count, &components, NULL, &ids)) {
        return ids;
    }
    ecs_table_t *table = ecs_table_find_or_create(world, &components);
    ids = new_w_data(world, table, NULL, count, NULL, NULL);
    ecs_defer_flush(world, stage);
    return ids;
}